

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O2

int do_setrlimit(int nargs,char **args)

{
  __rlimit_resource_t __resource;
  int iVar1;
  rlimit limit;
  rlimit local_28;
  
  __resource = atoi(args[1]);
  iVar1 = atoi(args[2]);
  local_28.rlim_cur = (rlim_t)iVar1;
  iVar1 = atoi(args[3]);
  local_28.rlim_max = (rlim_t)iVar1;
  iVar1 = setrlimit(__resource,&local_28);
  return iVar1;
}

Assistant:

int do_setrlimit(int nargs, char **args)
{
    struct rlimit limit;
    int resource;
    resource = atoi(args[1]);
    limit.rlim_cur = atoi(args[2]);
    limit.rlim_max = atoi(args[3]);
    return setrlimit(resource, &limit);
}